

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O0

char * ARM_insn_name(csh handle,uint id)

{
  uint id_local;
  csh handle_local;
  
  if (id < 0x1b3) {
    handle_local = (csh)insn_name_maps[id].name;
  }
  else {
    handle_local = 0;
  }
  return (char *)handle_local;
}

Assistant:

const char *ARM_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	if (id >= ARM_INS_ENDING)
		return NULL;

	return insn_name_maps[id].name;
#else
	return NULL;
#endif
}